

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall
Solution::maximumsSplicedArray
          (Solution *this,vector<int,_std::allocator<int>_> *nums1,
          vector<int,_std::allocator<int>_> *nums2)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  int *piVar5;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int i_1;
  int accu;
  int res;
  int i;
  allocator<int> local_4d;
  value_type local_4c;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> diff;
  int local_28;
  int sum2;
  int sum1;
  int n;
  vector<int,_std::allocator<int>_> *nums2_local;
  vector<int,_std::allocator<int>_> *nums1_local;
  Solution *this_local;
  
  _sum1 = nums2;
  nums2_local = nums1;
  nums1_local = (vector<int,_std::allocator<int>_> *)this;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(nums1);
  sum2 = (int)sVar3;
  local_28 = 0;
  diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  sVar3 = (size_type)sum2;
  local_4c = 0;
  std::allocator<int>::allocator(&local_4d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,sVar3,&local_4c,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  for (accu = 0; accu < sum2; accu = accu + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](nums2_local,(long)accu);
    local_28 = *pvVar4 + local_28;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](_sum1,(long)accu);
    diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         *pvVar4 + diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](nums2_local,(long)accu);
    iVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](_sum1,(long)accu);
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)accu);
    *pvVar4 = iVar1 - iVar2;
  }
  piVar5 = std::max<int>(&local_28,
                         (int *)((long)&diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 4));
  i_1 = *piVar5;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,0);
  local_68 = *pvVar4;
  for (local_6c = 1; iVar1 = i_1, local_6c < sum2; local_6c = local_6c + 1) {
    if (local_68 < 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_6c);
      if (*pvVar4 < 0) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_6c);
        local_68 = *pvVar4 + local_68;
      }
      else {
        local_74 = local_68;
        if (local_68 < 1) {
          local_74 = -local_68;
        }
        local_74 = local_28 + local_74;
        piVar5 = std::max<int>(&i_1,&local_74);
        i_1 = *piVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_6c);
        local_68 = *pvVar4;
      }
    }
    else {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_6c);
      if (*pvVar4 < 1) {
        local_70 = local_68;
        if (local_68 < 1) {
          local_70 = -local_68;
        }
        local_70 = diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + local_70;
        piVar5 = std::max<int>(&i_1,&local_70);
        i_1 = *piVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_6c);
        local_68 = *pvVar4;
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(long)local_6c);
        local_68 = *pvVar4 + local_68;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return iVar1;
}

Assistant:

int maximumsSplicedArray(vector<int>& nums1, vector<int>& nums2) {
        int n = nums1.size();
        int sum1 = 0, sum2 = 0;


        vector<int> diff(n, 0);
        for (int i = 0; i < n; i++) {
            sum1 += nums1[i];
            sum2 += nums2[i];
            diff[i] = nums1[i] - nums2[i];
        }


        int res = max(sum1, sum2);
        int accu = diff[0];
        for (int i = 1; i < n; i++) {
            if (accu > 0) {
                if (diff[i] > 0) accu += diff[i];
                else {
                    res = max(res, sum2 + abs(accu));
                    accu = diff[i];
                }
            } else {
                if (diff[i] < 0) accu += diff[i];
                else {
                    res = max(res, sum1 + abs(accu));
                    accu = diff[i];
                }
            }
        }



        return res;
    }